

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O0

string * __thiscall
BayesianGameIdenticalPayoff::SoftPrintUtilForJointType_abi_cxx11_
          (BayesianGameIdenticalPayoff *this,Index jtype)

{
  ostream *poVar1;
  void *pvVar2;
  uint in_EDX;
  long *in_RSI;
  string *in_RDI;
  double dVar3;
  Index jaI;
  stringstream ss;
  uint local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [380];
  uint local_14;
  
  local_14 = in_EDX;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Utility function for jtype ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  poVar1 = std::operator<<(poVar1,"with prob.=");
  dVar3 = (double)(**(code **)(*in_RSI + 0x68))(in_RSI,local_14);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"jtype\tja\tu(jtype,ja)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_1b0 = 0; (ulong)local_1b0 < (ulong)in_RSI[0x17]; local_1b0 = local_1b0 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(local_190,local_14);
    poVar1 = std::operator<<(poVar1,"\t");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0);
    poVar1 = std::operator<<(poVar1,"\t");
    dVar3 = (double)(**(code **)(*in_RSI + 0x80))(in_RSI,local_14,local_1b0);
    pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar3);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

string BayesianGameIdenticalPayoff::SoftPrintUtilForJointType(Index jtype) const
{
    stringstream ss;
    ss << "Utility function for jtype "<<jtype << 
        "with prob.="<< GetProbability(jtype) << endl;
    ss << "jtype\tja\tu(jtype,ja)"<<endl;
    for(Index jaI=0; jaI < _m_nrJA; jaI++)
        ss << jtype << "\t" << jaI << "\t" << GetUtility(jtype, jaI)<<endl;
    return(ss.str());
}